

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

int ToffoliGateCount(int controls,int lines)

{
  int local_24;
  int lines_local;
  int controls_local;
  
  switch(controls) {
  case 0:
  case 1:
    lines_local = 0;
    break;
  case 2:
    lines_local = 1;
    break;
  case 3:
    lines_local = 4;
    break;
  case 4:
    lines_local = 10;
    if (controls <= (lines + 1) / 2) {
      lines_local = 8;
    }
    break;
  default:
    if ((lines + 1) / 2 < controls) {
      local_24 = (controls + -3) * 8;
    }
    else {
      local_24 = (controls + -2) * 4;
    }
    lines_local = local_24;
  }
  return lines_local;
}

Assistant:

int ToffoliGateCount( int controls, int lines )
{
    switch ( controls )
    {
    case 0u:
    case 1u:
        return 0;
        break;
    case 2u:
        return 1;
        break;
    case 3u:
        return 4;
        break;
    case 4u:
        return ( ( ( lines + 1 ) / 2 ) >= controls ) ? 8 : 10;
        break;
    default:
        return ( ( ( lines + 1 ) / 2 ) >= controls ) ? 4 * ( controls - 2 ) : 8 * ( controls - 3 );
    }
}